

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O1

void __thiscall cmFindPackageCommand::FillPrefixesPackageRedirect(cmFindPackageCommand *this)

{
  cmMakefile *this_00;
  mapped_type *this_01;
  cmValue path;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string debugBuffer;
  string local_80;
  string local_60;
  string local_40;
  
  this_01 = std::
            map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
            ::operator[](&(this->super_cmFindCommon).LabeledPaths,
                         &PathLabel::PackageRedirect.super_PathLabel);
  this_00 = (this->super_cmFindCommon).Makefile;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"CMAKE_FIND_PACKAGE_REDIRECTS_DIR","");
  path = cmMakefile::GetDefinition(this_00,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((path.Value != (string *)0x0) && ((path.Value)->_M_string_length != 0)) {
    cmSearchPath::AddPath(this_01,path.Value);
  }
  if ((this->super_cmFindCommon).DebugMode == true) {
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"The internally managed CMAKE_FIND_PACKAGE_REDIRECTS_DIR.\n","");
    anon_unknown.dwarf_516175::collectPathsForDebug(&local_80,this_01,0);
    local_60._M_string_length = (size_type)(this->DebugBuffer)._M_dataplus._M_p;
    local_60._M_dataplus._M_p = (pointer)(this->DebugBuffer)._M_string_length;
    local_60.field_2._M_allocated_capacity = local_80._M_string_length;
    local_60.field_2._8_8_ = local_80._M_dataplus._M_p;
    views._M_len = 2;
    views._M_array = (iterator)&local_60;
    cmCatViews_abi_cxx11_(&local_40,views);
    std::__cxx11::string::operator=((string *)&this->DebugBuffer,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmFindPackageCommand::FillPrefixesPackageRedirect()
{
  cmSearchPath& paths = this->LabeledPaths[PathLabel::PackageRedirect];

  const auto redirectDir =
    this->Makefile->GetDefinition("CMAKE_FIND_PACKAGE_REDIRECTS_DIR");
  if (redirectDir && !redirectDir->empty()) {
    paths.AddPath(*redirectDir);
  }
  if (this->DebugMode) {
    std::string debugBuffer =
      "The internally managed CMAKE_FIND_PACKAGE_REDIRECTS_DIR.\n";
    collectPathsForDebug(debugBuffer, paths);
    this->DebugBuffer = cmStrCat(this->DebugBuffer, debugBuffer);
  }
}